

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

int32_t add_param_offset(int param_index,int32_t param_value,int32_t offset)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = (uint)(param_index == 5 || param_index == 2);
  iVar2 = ((int)(param_value + uVar1 * -0x10000) >>
          ((&DAT_004c14a0)[(ulong)(1 < param_index) * 4] & 0x1f)) + offset;
  iVar3 = 0x1000;
  if (iVar2 < 0x1000) {
    iVar3 = iVar2;
  }
  iVar2 = -0x1000;
  if (-0x1000 < iVar3) {
    iVar2 = iVar3;
  }
  return (iVar2 << ((&DAT_004c14a0)[(ulong)(1 < param_index) * 4] & 0x1f)) + uVar1 * 0x10000;
}

Assistant:

static int32_t add_param_offset(int param_index, int32_t param_value,
                                int32_t offset) {
  const int scale_vals[2] = { GM_TRANS_PREC_DIFF, GM_ALPHA_PREC_DIFF };
  const int clamp_vals[2] = { GM_TRANS_MAX, GM_ALPHA_MAX };
  // type of param: 0 - translation, 1 - affine
  const int param_type = (param_index < 2 ? 0 : 1);
  const int is_one_centered = (param_index == 2 || param_index == 5);

  // Make parameter zero-centered and offset the shift that was done to make
  // it compatible with the warped model
  param_value = (param_value - (is_one_centered << WARPEDMODEL_PREC_BITS)) >>
                scale_vals[param_type];
  // Add desired offset to the rescaled/zero-centered parameter
  param_value += offset;
  // Clamp the parameter so it does not overflow the number of bits allotted
  // to it in the bitstream
  param_value = (int32_t)clamp(param_value, -clamp_vals[param_type],
                               clamp_vals[param_type]);
  // Rescale the parameter to WARPEDMODEL_PRECISION_BITS so it is compatible
  // with the warped motion library
  param_value *= (1 << scale_vals[param_type]);

  // Undo the zero-centering step if necessary
  return param_value + (is_one_centered << WARPEDMODEL_PREC_BITS);
}